

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMul<(moira::Instr)81,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  ulong uVar2;
  
  uVar1 = readI<(moira::Size)2>(this);
  uVar2 = (ulong)(opcode >> 9 & 7);
  prefetch<4ul>(this);
  uVar1 = mul<(moira::Instr)81>(this,uVar1,(uint)*(ushort *)((long)this->exec + uVar2 * 4 + -0x58));
  *(u32 *)((long)this->exec + uVar2 * 4 + -0x58) = uVar1;
  return;
}

Assistant:

void
Moira::execMul(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execMulMusashi<I, M, S>(opcode);
        return;
    }

    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    result = mul<I>(data, readD<Word>(dst));
    
    writeD(dst, result);
}